

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_host.hpp
# Opt level: O0

Map_conflict4 * __thiscall
chains::
ModuleHost<chains::phasor::Module,std::tuple<chains::Parameter<chains::phasor::Frequency>>,chains::Expose<chains::phasor::Frequency>>
::makeInputMap<std::tuple,chains::Parameter<chains::phasor::Frequency>>
          (Map_conflict4 *__return_storage_ptr__,void *this,
          tuple<chains::Parameter<chains::phasor::Frequency>_> *parameters)

{
  Parameter<chains::phasor::Frequency> *this_00;
  type local_70;
  pair<boost::hana::type_impl<chains::phasor::Frequency>::_,_chains::CallbackInput> local_48;
  tuple<chains::Parameter<chains::phasor::Frequency>_> *local_20;
  tuple<chains::Parameter<chains::phasor::Frequency>_> *parameters_local;
  ModuleHost<chains::phasor::Module,_std::tuple<chains::Parameter<chains::phasor::Frequency>_>,_chains::Expose<chains::phasor::Frequency>_>
  *this_local;
  
  local_20 = parameters;
  parameters_local = (tuple<chains::Parameter<chains::phasor::Frequency>_> *)this;
  this_local = (ModuleHost<chains::phasor::Module,_std::tuple<chains::Parameter<chains::phasor::Frequency>_>,_chains::Expose<chains::phasor::Frequency>_>
                *)__return_storage_ptr__;
  this_00 = std::
            get<chains::Parameter<chains::phasor::Frequency>,chains::Parameter<chains::phasor::Frequency>>
                      (parameters);
  Parameter<chains::phasor::Frequency>::makeInput<true>(&local_70,this_00);
  boost::hana::make_t<boost::hana::pair_tag>::operator()
            (&local_48,(make_t<boost::hana::pair_tag> *)&boost::hana::make_pair,
             (_ *)&boost::hana::type_c<chains::phasor::Frequency>,&local_70);
  boost::hana::make_t<boost::hana::map_tag>::operator()
            (__return_storage_ptr__,(make_t<boost::hana::map_tag> *)&boost::hana::make_map,&local_48
            );
  boost::hana::pair<boost::hana::type_impl<chains::phasor::Frequency>::_,_chains::CallbackInput>::
  ~pair(&local_48);
  CallbackInput::~CallbackInput(&local_70);
  return __return_storage_ptr__;
}

Assistant:

auto makeInputMap(const Tuple<Parameter...>& parameters) const
  {
    using namespace boost::hana;
    return make_map(make_pair(
      type_c<typename Parameter::Traits>,
      std::get<Parameter>(parameters)
        .template makeInput<typeIsInPack<typename Parameter::Traits, Exposed...>>())...);
  }